

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::Segment::SetChunking(Segment *this,bool chunking,char *filename)

{
  bool bVar1;
  int iVar2;
  size_t __n;
  char *pcVar3;
  MkvWriter *pMVar4;
  
  if (0 < this->chunk_count_) {
    return false;
  }
  if (chunking) {
    if (filename == (char *)0x0) {
      return false;
    }
    if ((this->chunking_ == true) &&
       (iVar2 = strcmp(filename,this->chunking_base_name_), iVar2 == 0)) {
      return true;
    }
    __n = strlen(filename);
    pcVar3 = (char *)operator_new__(__n + 1,(nothrow_t *)&std::nothrow);
    if (pcVar3 == (char *)0x0) {
      return false;
    }
    memcpy(pcVar3,filename,__n);
    pcVar3[__n] = '\0';
    if (this->chunking_base_name_ != (char *)0x0) {
      operator_delete__(this->chunking_base_name_);
    }
    this->chunking_base_name_ = pcVar3;
    bVar1 = UpdateChunkName(this,"chk",&this->chunk_name_);
    if (!bVar1) {
      return false;
    }
    if (this->chunk_writer_cluster_ == (MkvWriter *)0x0) {
      pMVar4 = (MkvWriter *)operator_new(0x18,(nothrow_t *)&std::nothrow);
      if (pMVar4 == (MkvWriter *)0x0) {
        this->chunk_writer_cluster_ = (MkvWriter *)0x0;
        return false;
      }
      MkvWriter::MkvWriter(pMVar4);
      this->chunk_writer_cluster_ = pMVar4;
    }
    if (this->chunk_writer_cues_ == (MkvWriter *)0x0) {
      pMVar4 = (MkvWriter *)operator_new(0x18,(nothrow_t *)&std::nothrow);
      if (pMVar4 == (MkvWriter *)0x0) {
        this->chunk_writer_cues_ = (MkvWriter *)0x0;
        return false;
      }
      MkvWriter::MkvWriter(pMVar4);
      this->chunk_writer_cues_ = pMVar4;
    }
    if (this->chunk_writer_header_ == (MkvWriter *)0x0) {
      pMVar4 = (MkvWriter *)operator_new(0x18,(nothrow_t *)&std::nothrow);
      if (pMVar4 == (MkvWriter *)0x0) {
        this->chunk_writer_header_ = (MkvWriter *)0x0;
        return false;
      }
      MkvWriter::MkvWriter(pMVar4);
      this->chunk_writer_header_ = pMVar4;
    }
    bVar1 = MkvWriter::Open(this->chunk_writer_cluster_,this->chunk_name_);
    if (!bVar1) {
      return false;
    }
    pcVar3 = (char *)operator_new__(__n + 5,(nothrow_t *)&std::nothrow);
    if (pcVar3 == (char *)0x0) {
      return false;
    }
    memcpy(pcVar3,this->chunking_base_name_,__n);
    builtin_strncpy(pcVar3 + __n,".hdr",5);
    bVar1 = MkvWriter::Open(this->chunk_writer_header_,pcVar3);
    if (!bVar1) {
      operator_delete__(pcVar3);
      return false;
    }
    this->writer_cluster_ = &this->chunk_writer_cluster_->super_IMkvWriter;
    this->writer_cues_ = &this->chunk_writer_cues_->super_IMkvWriter;
    this->writer_header_ = &this->chunk_writer_header_->super_IMkvWriter;
    operator_delete__(pcVar3);
  }
  this->chunking_ = chunking;
  return true;
}

Assistant:

bool Segment::SetChunking(bool chunking, const char* filename) {
  if (chunk_count_ > 0)
    return false;

  if (chunking) {
    if (!filename)
      return false;

    // Check if we are being set to what is already set.
    if (chunking_ && !strcmp(filename, chunking_base_name_))
      return true;

    const size_t filename_length = strlen(filename);
    char* const temp = new (std::nothrow) char[filename_length + 1];  // NOLINT
    if (!temp)
      return false;

    memcpy(temp, filename, filename_length);
    temp[filename_length] = '\0';

    delete[] chunking_base_name_;
    chunking_base_name_ = temp;
    // From this point, strlen(chunking_base_name_) == filename_length

    if (!UpdateChunkName("chk", &chunk_name_))
      return false;

    if (!chunk_writer_cluster_) {
      chunk_writer_cluster_ = new (std::nothrow) MkvWriter();  // NOLINT
      if (!chunk_writer_cluster_)
        return false;
    }

    if (!chunk_writer_cues_) {
      chunk_writer_cues_ = new (std::nothrow) MkvWriter();  // NOLINT
      if (!chunk_writer_cues_)
        return false;
    }

    if (!chunk_writer_header_) {
      chunk_writer_header_ = new (std::nothrow) MkvWriter();  // NOLINT
      if (!chunk_writer_header_)
        return false;
    }

    if (!chunk_writer_cluster_->Open(chunk_name_))
      return false;

    const size_t hdr_length = strlen(".hdr");
    const size_t header_length = filename_length + hdr_length + 1;
    char* const header = new (std::nothrow) char[header_length];  // NOLINT
    if (!header)
      return false;

    memcpy(header, chunking_base_name_, filename_length);
    memcpy(&header[filename_length], ".hdr", hdr_length);
    header[filename_length + hdr_length] = '\0';

    if (!chunk_writer_header_->Open(header)) {
      delete[] header;
      return false;
    }

    writer_cluster_ = chunk_writer_cluster_;
    writer_cues_ = chunk_writer_cues_;
    writer_header_ = chunk_writer_header_;

    delete[] header;
  }

  chunking_ = chunking;

  return true;
}